

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O3

Vector __thiscall
stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::
getMomentaDotFromForces(IMUElasticLocalFrameDynamicalSystem *this,Vector *x,Vector *u)

{
  Index *this_00;
  double *pdVar1;
  DenseStorage<double,__1,__1,_1,_0> DVar2;
  uint uVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  Index IVar8;
  Index IVar9;
  Index IVar10;
  double *pdVar11;
  _func_int *p_Var12;
  _func_int *p_Var13;
  _func_int *p_Var14;
  IMUElasticLocalFrameDynamicalSystem *pIVar15;
  bool bVar16;
  char cVar17;
  PointerType ptr;
  long lVar18;
  reference pMVar19;
  _func_int **pp_Var20;
  undefined8 *puVar21;
  long *in_RCX;
  long lVar22;
  char *__function;
  long lVar23;
  ulong uVar24;
  Index extraout_RDX;
  int iVar25;
  ActualDstType actualDst_2;
  long *plVar26;
  ActualDstType actualDst_1;
  bool bVar27;
  uint uVar28;
  ulong uVar29;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar30;
  double dVar31;
  double *pdVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  Vector VVar37;
  assign_op<double,_double> local_179;
  DstXprType local_178;
  undefined1 local_138 [24];
  long *local_120;
  double local_118;
  undefined8 uStack_110;
  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
  *local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  Index *local_d8;
  ActualDstType actualDst;
  Vector3 *local_c8;
  Vector *local_c0;
  Index *local_b8;
  Vector3 *local_b0;
  IMUElasticLocalFrameDynamicalSystem *local_a8;
  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
  *local_a0;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_98;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_78;
  DstEvaluatorType dstEvaluator_1;
  SrcEvaluatorType srcEvaluator;
  
  cVar17 = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data[8])(x,u);
  if (cVar17 == '\0') {
    __assert_fail("checkStateVector(v) && \"ERROR: The state vector has the wrong size\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/dynamical-system/dynamical-system-functor-base.hpp"
                  ,0x42,
                  "void stateObservation::DynamicalSystemFunctorBase::assertStateVector_(const Vector &)"
                 );
  }
  cVar17 = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data[9])(x);
  if (cVar17 == '\0') {
    __assert_fail("checkInputvector(v) && \"ERROR: The input vector has the wrong size\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/dynamical-system/dynamical-system-functor-base.hpp"
                  ,0x47,
                  "void stateObservation::DynamicalSystemFunctorBase::assertInputVector_(const Vector &)"
                 );
  }
  if (2 < (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    pdVar4 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar33 = pdVar4[1];
    x[0x4a].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)*pdVar4;
    x[0x4a].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)dVar33;
    x[0x4b].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)pdVar4[2];
    if (5 < (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar4 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      DVar2 = *(DenseStorage<double,__1,__1,_1,_0> *)(pdVar4 + 3);
      pdVar32 = DVar2.m_data;
      dVar33 = (double)DVar2.m_rows;
      *(DenseStorage<double,__1,__1,_1,_0> *)
       &x[0x4e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           DVar2;
      pdVar4 = (double *)pdVar4[5];
      x[0x4f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           (Index)pdVar4;
      pdVar1 = x[0x116].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      local_120 = in_RCX;
      local_a8 = this;
      if ((((((double)pdVar1 != (double)pdVar32) || (NAN((double)pdVar1) || NAN((double)pdVar32)))
           || (dVar34 = (double)x[0x116].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows, dVar34 != dVar33)) ||
          ((NAN(dVar34) || NAN(dVar33) ||
           (pdVar1 = x[0x117].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data, (double)pdVar1 != (double)pdVar4)))) ||
         (NAN((double)pdVar1) || NAN((double)pdVar4))) {
        x[0x116].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage = DVar2;
        x[0x117].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             pdVar4;
        dVar34 = (double)pdVar4 * (double)pdVar4 +
                 dVar33 * dVar33 + (double)pdVar32 * (double)pdVar32;
        dVar33 = SQRT(dVar34);
        if (9.999999999999999e-33 < dVar34) {
          auVar7._8_4_ = SUB84(dVar33,0);
          auVar7._0_8_ = dVar33;
          auVar7._12_4_ = (int)((ulong)dVar33 >> 0x20);
          local_138._0_16_ = divpd((undefined1  [16])DVar2,auVar7);
          local_118 = (double)pdVar4 / dVar33;
        }
        else {
          local_138._0_16_ = ZEXT816(0);
          local_118 = 1.0;
        }
        uStack_110 = 0;
        local_108 = (_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                     *)(-(ulong)(9.999999999999999e-33 < dVar34) & (ulong)dVar33);
        uStack_100 = 0;
        dVar33 = sin((double)local_108);
        local_f8._8_4_ = SUB84(dVar33 * (double)local_138._8_8_,0);
        local_f8._0_8_ = dVar33 * (double)local_138._0_8_;
        local_f8._12_4_ = (int)((ulong)(dVar33 * (double)local_138._8_8_) >> 0x20);
        local_e8._8_4_ = extraout_XMM0_Dc;
        local_e8._0_8_ = dVar33 * local_118;
        local_e8._12_4_ = extraout_XMM0_Dd;
        dVar34 = cos((double)local_108);
        dVar35 = 1.0 - dVar34;
        dVar30 = dVar35 * (double)local_138._0_8_;
        dVar33 = dVar35 * local_118 * local_118 + dVar34;
        x[0x111].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (Index)(dVar34 + dVar30 * (double)local_138._0_8_);
        x[0x112].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)((double)local_e8._0_8_ + dVar30 * (double)local_138._8_8_);
        x[0x112].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (Index)(local_118 * dVar30 - (double)local_f8._8_8_);
        x[0x113].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)(dVar30 * (double)local_138._8_8_ - (double)local_e8._0_8_);
        dVar31 = dVar35 * (double)local_138._8_8_ * local_118;
        dVar6 = (double)local_f8._0_8_ + dVar31;
        auVar5._8_4_ = SUB84(dVar6,0);
        auVar5._0_8_ = dVar34 + dVar35 * (double)local_138._8_8_ * (double)local_138._8_8_;
        auVar5._12_4_ = (int)((ulong)dVar6 >> 0x20);
        *(undefined1 (*) [16])
         &x[0x113].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             auVar5;
        x[0x114].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (Index)((double)local_f8._8_8_ + local_118 * dVar30);
        x[0x115].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)(dVar31 - (double)local_f8._0_8_);
        x[0x115].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (Index)dVar33;
      }
      else {
        dVar33 = (double)x[0x115].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows;
      }
      local_b0 = (Vector3 *)(x + 0x4a);
      local_c0 = x + 0x47;
      local_b8 = &x[0x54].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows;
      pdVar4 = x[0x112].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      IVar8 = x[0x112].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      pdVar1 = x[0x113].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      IVar9 = x[0x113].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      pdVar32 = x[0x114].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data;
      IVar10 = x[0x114].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      pdVar11 = x[0x115].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data;
      x[0x54].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           x[0x111].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      x[0x55].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar4;
      x[0x55].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           IVar8;
      x[0x56].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar1;
      x[0x56].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           IVar9;
      x[0x57].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar32;
      x[0x57].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           IVar10;
      x[0x58].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar11;
      x[0x58].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           (Index)dVar33;
      this_00 = &x[0xc2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows;
      local_138._0_8_ =
           &x[0xc1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      uVar29 = 0;
      bVar16 = true;
      do {
        bVar27 = bVar16;
        local_178.super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.m_startRow
        .m_value = uVar29 * 6 + 0xc;
        local_178.super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>.m_data =
             (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
             uVar29 * 6 + 0xc;
        local_178.super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
        m_outerStride =
             (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
        local_178.super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>.m_rows.
        m_value = 6;
        local_178.super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.m_xpr =
             (XprTypeNested)u;
        if (local_178.
            super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
            m_outerStride + -6 <
            local_178.
            super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
            m_startRow.m_value) goto LAB_00152683;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_98,
                   (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)&local_178);
        pdVar4 = x[0xc6].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
        lVar22 = (x[0xc4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows - (long)x[0xc5].
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_data >> 3) * -0x5555555555555555 +
                 (((long)pdVar4 -
                   (long)x[0xc4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data >> 3) + -1 + (ulong)(pdVar4 == (double *)0x0)) * 0x15;
        lVar18 = x[0xc3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows - x[0xc2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows >> 3;
        lVar23 = lVar18 * -0x5555555555555555 + lVar22;
        if (lVar23 == 0) {
LAB_00151bdd:
          if (lVar22 == lVar18 * 0x5555555555555555) {
            *(int *)&x[0xc1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data = (int)uVar29;
          }
          std::
          deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::push_back((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       *)local_138._0_8_,(value_type *)&local_98);
        }
        else {
          uVar28 = *(uint *)&x[0xc1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data;
          uVar24 = lVar23 + (ulong)uVar28;
          if ((uVar29 < uVar28) || (uVar24 <= uVar29)) {
            if (uVar24 == uVar29) goto LAB_00151bdd;
            goto LAB_0015271a;
          }
          pMVar19 = std::
                    _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                    ::operator[]((_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                                  *)this_00,(ulong)((int)uVar29 - uVar28));
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                    (pMVar19,(Matrix<double,__1,__1,_0,__1,__1> *)&local_98,
                     (assign_op<double,_double> *)&local_78);
        }
        free(local_98.m_dst);
        uVar29 = 1;
        bVar16 = false;
      } while (bVar27);
      if (0x1a < (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows) {
        pdVar4 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        dVar33 = pdVar4[0x19];
        x[0xcb].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)pdVar4[0x18];
        x[0xcb].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (Index)dVar33;
        x[0xcc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)pdVar4[0x1a];
        if (0x1d < (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_rows) {
          local_c8 = (Vector3 *)(x + 0xcb);
          pdVar4 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          actualDst = (ActualDstType)
                      &x[0xcc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows;
          pdVar1 = (double *)pdVar4[0x1c];
          x[0xcc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
               (Index)pdVar4[0x1b];
          x[0xcd].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
               pdVar1;
          x[0xcd].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
               (Index)pdVar4[0x1d];
          local_d8 = &x[0x14].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows;
          local_138._0_8_ =
               &x[0x15].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
          uVar29 = 0;
          bVar16 = true;
          do {
            bVar27 = bVar16;
            pdVar4 = x[0xc6].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            lVar18 = (x[0xc3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows -
                      x[0xc2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows >> 3) * -0x5555555555555555 +
                     (x[0xc4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows -
                      (long)x[0xc5].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data >> 3) * -0x5555555555555555 +
                     (((long)pdVar4 -
                       (long)x[0xc4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data >> 3) + -1 + (ulong)(pdVar4 == (double *)0x0)) * 0x15;
            if (lVar18 == 0) {
LAB_00152664:
              __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                            ,0x9b,
                            "void stateObservation::IndexedMatrixArray::check_(unsigned int) const")
              ;
            }
            uVar28 = *(uint *)&x[0xc1].
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data;
            if ((uVar29 < uVar28) || (lVar18 + (ulong)uVar28 <= uVar29)) goto LAB_00152664;
            pMVar19 = std::
                      _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                      ::operator[]((_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                                    *)this_00,(ulong)((int)uVar29 - uVar28));
            if (((pMVar19->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_rows < 3) ||
               ((pMVar19->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_cols < 1)) {
LAB_0015269c:
              __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                            ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                            "Eigen::Block<Eigen::Matrix<double, -1, -1>, 3, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
                           );
            }
            if ((long)x[0x15].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data + -3 < (long)(uVar29 * 3)) {
LAB_001526bd:
              __function = 
              "Eigen::Block<Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
              ;
              goto LAB_001526eb;
            }
            pdVar1 = (pMVar19->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data;
            lVar18 = x[0x14].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            dVar33 = pdVar1[1];
            pdVar4 = (double *)(lVar18 + uVar29 * 0x18);
            *pdVar4 = *pdVar1;
            pdVar4[1] = dVar33;
            *(double *)(lVar18 + 0x10 + uVar29 * 0x18) = pdVar1[2];
            pdVar4 = x[0xc6].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            lVar18 = (x[0xc3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows -
                      x[0xc2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows >> 3) * -0x5555555555555555 +
                     (x[0xc4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows -
                      (long)x[0xc5].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data >> 3) * -0x5555555555555555 +
                     (((long)pdVar4 -
                       (long)x[0xc4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data >> 3) + -1 + (ulong)(pdVar4 == (double *)0x0)) * 0x15;
            if (lVar18 == 0) goto LAB_00152664;
            uVar28 = *(uint *)&x[0xc1].
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data;
            if ((uVar29 < uVar28) || (lVar18 + (ulong)uVar28 <= uVar29)) goto LAB_00152664;
            pMVar19 = std::
                      _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                      ::operator[]((_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                                    *)this_00,(ulong)((int)uVar29 - uVar28));
            if (((pMVar19->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_rows < 6) ||
               ((pMVar19->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_cols < 1)) goto LAB_0015269c;
            if ((long)x[0x16].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data + -3 < (long)(uVar29 * 3)) goto LAB_001526bd;
            pdVar1 = (pMVar19->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data;
            lVar18 = *(long *)local_138._0_8_;
            dVar33 = pdVar1[4];
            pdVar4 = (double *)(lVar18 + uVar29 * 0x18);
            *pdVar4 = pdVar1[3];
            pdVar4[1] = dVar33;
            *(double *)(lVar18 + 0x10 + uVar29 * 0x18) = pdVar1[5];
            uVar29 = 1;
            bVar16 = false;
          } while (bVar27);
          lVar18 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_rows;
          if (0x1f < lVar18) {
            srcEvaluator.
            super_block_evaluator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
            super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            .m_data = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                      m_data + 0x1e;
            local_178.
            super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>.
            m_data = (PointerType)(x + 0x53);
            local_78.m_row = 0;
            local_78.m_col = 1;
            local_78.m_currentBlockRows = 2;
            local_178.
            super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>.
            m_rows.m_value = 2;
            local_178.
            super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>.
            m_cols.m_value = 1;
            local_178.
            super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
            m_startRow.m_value = 0;
            local_178.
            super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
            m_startCol.m_value = 0;
            local_178.
            super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
            m_outerStride = 3;
            local_98.m_src = &srcEvaluator;
            local_98.m_dst = &dstEvaluator_1;
            local_98.m_functor = &local_179;
            local_98.m_dstExpr = &local_178;
            local_178.
            super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.m_xpr =
                 (XprTypeNested)
                 local_178.
                 super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                 .m_data;
            local_78.m_xpr =
                 (Matrix<double,_3,_1,_0,_3,_1> *)
                 local_178.
                 super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                 .m_data;
            dstEvaluator_1.
            super_block_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_3,_1>_>
            .m_data = local_178.
                      super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                      .m_data;
            srcEvaluator.
            super_block_evaluator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
            super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            .m_outerStride.m_value = lVar18;
            Eigen::internal::
            dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
            ::run(&local_98);
            local_178.
            super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>.
            m_data = (double *)0x0;
            Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                      (&local_78,(Scalar *)&local_178);
            if ((local_78.m_currentBlockRows + local_78.m_row != 3) || (local_78.m_col != 1)) {
              __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                            ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                            "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
                           );
            }
            if (2 < local_120[1]) {
              pdVar4 = (double *)*local_120;
              dVar34 = *pdVar4;
              pdVar1 = (double *)pdVar4[1];
              x[0x8e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows = (Index)dVar34;
              x[0x8f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data = pdVar1;
              dVar33 = pdVar4[2];
              x[0x8f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows = (Index)dVar33;
              if (*(char *)((long)&x[0x43].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows + 5) != '\0') {
                dVar6 = (double)x[0x53].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows;
                x[0x8e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = (Index)(dVar34 - (double)x[0x53].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data);
                x[0x8f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = (double *)((double)pdVar1 - dVar6);
                x[0x8f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = (Index)(dVar33 - (double)x[0x54].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data);
              }
              local_118 = (double)(ulong)*(uint *)((long)&x[0x13].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + 4);
              plVar26 = local_120;
              if (local_118 != 0.0) {
                local_108 = (_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                             *)&x[0xa3].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows;
                local_e8._0_8_ =
                     &x[0xa2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows;
                local_a0 = (_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                            *)(x + 0xa9);
                local_f8._0_8_ = x + 0xa8;
                uVar28 = 0x33;
                dVar33 = 0.0;
                do {
                  uVar29 = (ulong)(uVar28 - 3);
                  if (plVar26[1] + -3 < (long)uVar29) goto LAB_001526d6;
                  lVar18 = *plVar26;
                  local_178.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                  .m_data = (double *)0x0;
                  local_178.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                  .m_rows.m_value = 0;
                  local_178.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                  .m_cols.m_value = 0;
                  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                            ((DenseStorage<double,__1,__1,__1,_0> *)&local_178,3,3,1);
                  if (((local_178.
                        super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                        .m_rows.m_value != 3) ||
                      (local_178.
                       super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                       .m_cols.m_value != 1)) &&
                     ((Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                                 ((DenseStorage<double,__1,__1,__1,_0> *)&local_178,3,3,1),
                      local_178.
                      super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                      .m_rows.m_value != 3 ||
                      (local_178.
                       super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                       .m_cols.m_value != 1)))) goto LAB_001526f9;
                  plVar26 = local_120;
                  pdVar4 = (double *)(lVar18 + uVar29 * 8);
                  dVar34 = pdVar4[1];
                  *local_178.
                   super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                   .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                   .m_data = *pdVar4;
                  local_178.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                  .m_data[1] = dVar34;
                  local_178.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                  .m_data[2] = *(double *)(lVar18 + 0x10 + uVar29 * 8);
                  pdVar4 = x[0xa7].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data;
                  lVar22 = (x[0xa5].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows -
                            (long)x[0xa6].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data >> 3) * -0x5555555555555555 +
                           (((long)pdVar4 -
                             (long)x[0xa5].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_data >> 3) + -1 + (ulong)(pdVar4 == (double *)0x0)) *
                           0x15;
                  lVar18 = x[0xa4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows -
                           x[0xa3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows >> 3;
                  lVar23 = lVar18 * -0x5555555555555555 + lVar22;
                  iVar25 = SUB84(dVar33,0);
                  if (lVar23 == 0) {
LAB_0015216a:
                    if (lVar22 == lVar18 * 0x5555555555555555) {
                      *(int *)&x[0xa2].
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data = iVar25;
                    }
                    std::
                    deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                    ::push_back((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                 *)local_e8._0_8_,(value_type *)&local_178);
                  }
                  else {
                    uVar3 = *(uint *)&x[0xa2].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_data;
                    dVar34 = (double)(lVar23 + (ulong)uVar3);
                    if (((ulong)dVar33 < (ulong)uVar3) || ((ulong)dVar34 <= (ulong)dVar33)) {
                      if (dVar33 == dVar34) goto LAB_0015216a;
LAB_0015271a:
                      __assert_fail("(v_.size()==0 || k_+v_.size() == time )&& \"Error: New time instants must be consecutive to existing ones\""
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                                    ,0xaa,
                                    "void stateObservation::IndexedMatrixArray::checkNext_(unsigned int) const"
                                   );
                    }
                    pMVar19 = std::
                              _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                              ::operator[](local_108,(ulong)(iVar25 - uVar3));
                    Eigen::internal::
                    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                              (pMVar19,(Matrix<double,__1,__1,_0,__1,__1> *)&local_178,
                               (assign_op<double,_double> *)&local_98);
                  }
                  free(local_178.
                       super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                       .m_data);
                  uVar29 = (ulong)uVar28;
                  if (plVar26[1] + -3 < (long)uVar29) goto LAB_001526d6;
                  lVar18 = *plVar26;
                  local_178.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                  .m_data = (double *)0x0;
                  local_178.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                  .m_rows.m_value = 0;
                  local_178.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                  .m_cols.m_value = 0;
                  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                            ((DenseStorage<double,__1,__1,__1,_0> *)&local_178,3,3,1);
                  if (((local_178.
                        super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                        .m_rows.m_value != 3) ||
                      (local_178.
                       super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                       .m_cols.m_value != 1)) &&
                     ((Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                                 ((DenseStorage<double,__1,__1,__1,_0> *)&local_178,3,3,1),
                      local_178.
                      super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                      .m_rows.m_value != 3 ||
                      (local_178.
                       super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                       .m_cols.m_value != 1)))) {
LAB_001526f9:
                    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Block<const Eigen::Matrix<double, -1, 1>, 3, 1>, T1 = double, T2 = double]"
                                 );
                  }
                  plVar26 = local_120;
                  pdVar4 = (double *)(lVar18 + uVar29 * 8);
                  dVar34 = pdVar4[1];
                  *local_178.
                   super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                   .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                   .m_data = *pdVar4;
                  local_178.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                  .m_data[1] = dVar34;
                  local_178.
                  super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                  .m_data[2] = *(double *)(lVar18 + 0x10 + uVar29 * 8);
                  lVar18 = x[0xac].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows;
                  lVar22 = ((long)x[0xab].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data -
                            x[0xab].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows >> 3) * -0x5555555555555555 +
                           ((lVar18 - x[0xaa].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_rows >> 3) + -1 + (ulong)(lVar18 == 0)) * 0x15;
                  lVar18 = (long)x[0xaa].
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_data -
                           (long)x[0xa9].
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_data >> 3;
                  lVar23 = lVar18 * -0x5555555555555555 + lVar22;
                  if (lVar23 == 0) {
LAB_001522e7:
                    if (lVar22 == lVar18 * 0x5555555555555555) {
                      *(int *)&x[0xa7].
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows = iVar25;
                    }
                    std::
                    deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                    ::push_back((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                 *)local_f8._0_8_,(value_type *)&local_178);
                  }
                  else {
                    uVar3 = (uint)x[0xa7].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows;
                    dVar34 = (double)(lVar23 + (ulong)uVar3);
                    if (((ulong)dVar33 < (ulong)uVar3) || ((ulong)dVar34 <= (ulong)dVar33)) {
                      if (dVar33 == dVar34) goto LAB_001522e7;
                      goto LAB_0015271a;
                    }
                    pMVar19 = std::
                              _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                              ::operator[](local_a0,(ulong)(iVar25 - uVar3));
                    Eigen::internal::
                    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                              (pMVar19,(Matrix<double,__1,__1,_0,__1,__1> *)&local_178,
                               (assign_op<double,_double> *)&local_98);
                  }
                  free(local_178.
                       super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>
                       .m_data);
                  dVar33 = (double)((long)dVar33 + 1);
                  uVar28 = uVar28 + 0xc;
                } while (local_118 != dVar33);
              }
              pIVar15 = local_a8;
              if (0x2c < plVar26[1]) {
                lVar18 = *plVar26;
                pdVar4 = *(double **)(lVar18 + 0x158);
                x[0xf0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = *(Index *)(lVar18 + 0x150);
                x[0xf1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = pdVar4;
                x[0xf1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = *(Index *)(lVar18 + 0x160);
                if (0x2f < plVar26[1]) {
                  lVar18 = *plVar26;
                  IVar8 = *(Index *)(lVar18 + 0x170);
                  x[0xf2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data = *(double **)(lVar18 + 0x168);
                  x[0xf2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows = IVar8;
                  x[0xf3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data = *(double **)(lVar18 + 0x178);
                  computeContactWrench
                            ((IMUElasticLocalFrameDynamicalSystem *)x,(Matrix3 *)local_b8,local_b0,
                             (IndexedMatrixArray *)(x + 0xa2),
                             (IndexedMatrixArray *)
                             &x[0xa7].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              .m_storage.m_rows,(Vector *)local_d8,(Vector *)local_138._0_8_,
                             local_c8,actualDst,
                             (Vector3 *)
                             &x[0xf0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              .m_storage.m_rows,(Vector3 *)(x + 0xf2));
                  pdVar4 = cst::gravity;
                  if (DAT_00193890 < 0) {
                    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                                 );
                  }
                  if (DAT_00193890 != 3) {
                    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                                  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, 3, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, 3, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
                                 );
                  }
                  pdVar1 = x[199].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data;
                  dVar33 = cst::gravity[1];
                  x[0x47].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data = (double *)
                           ((double)x[0xc6].
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                    m_storage.m_rows - *cst::gravity * 56.8);
                  x[0x47].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows = (Index)((double)pdVar1 - dVar33 * 56.8);
                  x[0x48].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data = (double *)
                           (pdVar4[2] * -56.8 +
                           (double)x[199].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows);
                  dVar33 = (double)x[0x8e].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows;
                  pdVar1 = x[0x8f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data;
                  dVar34 = (double)x[0x8f].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows;
                  dVar31 = dVar34 * (double)x[0x57].
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_rows +
                           (double)pdVar1 *
                           (double)x[0x56].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_data +
                           dVar33 * (double)x[0x54].
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_rows +
                           (double)x[0x4a].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_data;
                  dVar35 = dVar34 * (double)x[0x58].
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_data +
                           (double)pdVar1 *
                           (double)x[0x56].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows +
                           dVar33 * (double)x[0x55].
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_data +
                           (double)x[0x4a].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows;
                  dVar36 = (double)x[0x58].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows * dVar34 +
                           (double)x[0x57].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_data * (double)pdVar1 +
                           dVar33 * (double)x[0x55].
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_rows +
                           (double)x[0x4b].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_data;
                  dVar33 = (double)x[0xca].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows;
                  pdVar1 = x[0xca].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data;
                  dVar34 = *pdVar4;
                  dVar6 = pdVar4[1];
                  dVar30 = pdVar4[2];
                  x[0x48].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows = (Index)((double)x[0xc9].
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           .m_storage.m_rows -
                                  (dVar30 * dVar35 * 56.8 + dVar6 * dVar36 * -56.8 + dVar34 * 0.0));
                  x[0x49].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data = (double *)
                           ((double)pdVar1 -
                           (dVar30 * -dVar31 * 56.8 + dVar6 * 0.0 + dVar34 * dVar36 * 56.8));
                  x[0x49].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows = (Index)(dVar33 - (dVar30 * 0.0 + dVar31 * 56.8 * dVar6 +
                                            dVar35 * -56.8 * dVar34));
                  (pIVar15->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase =
                       (_func_int **)0x0;
                  *(undefined8 *)&pIVar15->printed_ = 0;
                  pp_Var20 = (_func_int **)malloc(0x30);
                  if (((ulong)pp_Var20 & 0xf) != 0) {
                    __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                                  ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                                  "void *Eigen::internal::aligned_malloc(std::size_t)");
                  }
                  if (pp_Var20 != (_func_int **)0x0) {
                    (pIVar15->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase =
                         pp_Var20;
                    *(undefined8 *)&pIVar15->printed_ = 6;
                    pdVar4 = (local_c0->
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                             m_storage.m_data;
                    p_Var12 = (_func_int *)
                              (local_c0->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                              m_storage.m_rows;
                    pdVar1 = local_c0[1].
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data;
                    p_Var13 = (_func_int *)
                              local_c0[1].
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows;
                    p_Var14 = (_func_int *)
                              local_c0[2].
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows;
                    pp_Var20[4] = (_func_int *)
                                  local_c0[2].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data;
                    pp_Var20[5] = p_Var14;
                    pp_Var20[2] = (_func_int *)pdVar1;
                    pp_Var20[3] = p_Var13;
                    *pp_Var20 = (_func_int *)pdVar4;
                    pp_Var20[1] = p_Var12;
                    VVar37.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows = extraout_RDX;
                    VVar37.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_data = (double *)pIVar15;
                    return (Vector)VVar37.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage;
                  }
                  puVar21 = (undefined8 *)__cxa_allocate_exception(8);
                  *puVar21 = std::ios::widen;
                  __cxa_throw(puVar21,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                }
              }
            }
LAB_001526d6:
            __function = 
            "Eigen::Block<const Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
            ;
            goto LAB_001526eb;
          }
        }
      }
    }
  }
LAB_00152683:
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_001526eb:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

Vector IMUElasticLocalFrameDynamicalSystem::getMomentaDotFromForces(const Vector& x, const Vector& u)
    {
        assertStateVector_(x);
        assertInputVector_(u);

        // Getting flexibility
        op_.positionFlex=x.segment(state::pos,3);
        op_.orientationFlexV=x.segment(state::ori,3);
        op_.rFlex = computeRotation_(op_.orientationFlexV,0);

        // Getting contact forces
        for (int i=0; i<hrp2::contact::nbModeledMax; ++i)
            op_.efforts.setValue(x.segment(state::fc+6*i,6),i);

        op_.fm=x.segment(state::unmodeledForces,3);
        op_.tm=x.segment(state::unmodeledForces+3,3);
        for (int i=0; i<hrp2::contact::nbModeledMax; ++i)
        {
            fc_.segment<3>(3*i) = op_.efforts[i].block<3,1>(0,0);
            tc_.segment<3>(3*i) = op_.efforts[i].block<3,1>(3,0);
        }

        // Getting CoM
        op_.positionComBias <<  x.segment(state::comBias,2),
                                0;// the bias of the com along the z axis is assumed 0.
        op_.positionCom=u.segment<3>(input::posCom);
        if(withComBias_) op_.positionCom-=op_.positionComBias;


        // Getting contact positions
        unsigned nbContacts(getContactsNumber());
        for (unsigned i = 0; i<nbContacts ; ++i)
        {
          // Positions
          op_.contactPosV.setValue(u.segment<3>(input::contacts + 12*i),i);
          op_.contactOriV.setValue(u.segment<3>(input::contacts +12*i+3),i);
        }

        op_.addForce = u.segment<3>(input::additionalForces);
        op_.addMoment = u.segment<3>(input::additionalForces+3);

        computeContactWrench(op_.rFlex, op_.positionFlex, op_.contactPosV, op_.contactOriV,
                             fc_, tc_, op_.fm, op_.tm, op_.addForce, op_.addMoment);


        op_.momentaDot.segment<3>(0) = op_.f - hrp2::m*cst::gravity;
        op_.momentaDot.segment<3>(3) = op_.t - kine::skewSymmetric(op_.rFlex*op_.positionCom+op_.positionFlex)*hrp2::m*cst::gravity;

        return op_.momentaDot;
    }